

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_2::DeepScanLineInputFile::Data::~Data(Data *this)

{
  value_type pLVar1;
  size_type sVar2;
  reference ppLVar3;
  reference ppIVar4;
  long in_RDI;
  size_t i_1;
  size_t i;
  LineBuffer *in_stack_ffffffffffffffb0;
  value_type in_stack_ffffffffffffffc0;
  ulong local_18;
  ulong local_10;
  
  for (local_10 = 0;
      sVar2 = std::
              vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
              ::size((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                      *)(in_RDI + 0x150)), local_10 < sVar2; local_10 = local_10 + 1) {
    ppLVar3 = std::
              vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
              ::operator[]((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                            *)(in_RDI + 0x150),local_10);
    if (*ppLVar3 != (value_type)0x0) {
      ppLVar3 = std::
                vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                ::operator[]((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                              *)(in_RDI + 0x150),local_10);
      pLVar1 = *ppLVar3;
      if (pLVar1 != (value_type)0x0) {
        anon_unknown_0::LineBuffer::~LineBuffer(in_stack_ffffffffffffffb0);
        operator_delete(pLVar1,0xa0);
      }
    }
  }
  for (local_18 = 0;
      sVar2 = std::
              vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
              ::size((vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                      *)(in_RDI + 0x138)), local_18 < sVar2; local_18 = local_18 + 1) {
    ppIVar4 = std::
              vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
              ::operator[]((vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                            *)(in_RDI + 0x138),local_18);
    in_stack_ffffffffffffffc0 = *ppIVar4;
    if (in_stack_ffffffffffffffc0 != (value_type)0x0) {
      operator_delete(in_stack_ffffffffffffffc0,0x48);
    }
  }
  if ((*(long *)(in_RDI + 0x1e8) != 0) && (*(long **)(in_RDI + 0x1e8) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0x1e8) + 8))();
  }
  if (((*(byte *)(in_RDI + 0x174) & 1) != 0) &&
     (in_stack_ffffffffffffffb0 = *(LineBuffer **)(in_RDI + 0x178),
     in_stack_ffffffffffffffb0 != (LineBuffer *)0x0)) {
    (**(code **)(in_stack_ffffffffffffffb0->uncompressedData + 8))();
  }
  Array<char>::~Array((Array<char> *)in_stack_ffffffffffffffb0);
  Array<bool>::~Array((Array<bool> *)in_stack_ffffffffffffffb0);
  Array<unsigned_int>::~Array((Array<unsigned_int> *)in_stack_ffffffffffffffb0);
  Array2D<unsigned_int>::~Array2D((Array2D<unsigned_int> *)in_stack_ffffffffffffffb0);
  std::
  vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
  ::~vector((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
             *)in_stack_ffffffffffffffc0);
  std::
  vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
  ::~vector((vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
             *)in_stack_ffffffffffffffc0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffc0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffc0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffc0);
  DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x195286);
  Header::~Header((Header *)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

DeepScanLineInputFile::Data::~Data ()
{
    for (size_t i = 0; i < lineBuffers.size (); i++)
        if (lineBuffers[i] != 0) delete lineBuffers[i];

    for (size_t i = 0; i < slices.size (); i++)
        delete slices[i];

    if (sampleCountTableComp != 0) delete sampleCountTableComp;

    if (multiPartBackwardSupport) delete multiPartFile;
}